

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTrajectory.cpp
# Opt level: O3

void __thiscall chrono::ChLinkTrajectory::ChLinkTrajectory(ChLinkTrajectory *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 auVar2 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ChFunction *__tmp;
  
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkTrajectory_00b1b4f8;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->modulo_s = false;
  (this->super_ChLinkLockLock).super_ChLinkLock.type = TRAJECTORY;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x28);
  auVar2 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b10d00;
  p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b458a8;
  *(undefined1 (*) [16])&p_Var6[1]._M_use_count = auVar2;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var6 + 1);
  p_Var1 = (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var6;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x50);
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  auVar2._8_8_ = DAT_00b689a0;
  auVar2._0_8_ = VNULL;
  _Var5._M_use_count = (undefined4)DAT_00b689a8;
  _Var5._M_weak_count = DAT_00b689a8._4_4_;
  _Var5._vptr__Sp_counted_base = DAT_00b689a0;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b1b310;
  *(undefined1 *)&p_Var6[1]._M_use_count = 0;
  p_Var6[1]._M_weak_count = 2;
  p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChGeometry_00b3d8b8;
  _Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
          vunpcklpd_avx(auVar2,(undefined1  [16])_Var5);
  _Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
          vshufpd_avx((undefined1  [16])_Var5,auVar2,1);
  p_Var6[3] = _Var3;
  p_Var6[2] = _Var4;
  p_Var6[4] = _Var5;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var6 + 1);
  p_Var1 = (this->trajectory_line).
           super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var6;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  ChLinkMaskLF::SetLockMask
            (&(this->super_ChLinkLockLock).super_ChLinkLock.mask,true,true,true,false,false,false,
             false);
  ChLinkLock::BuildLink((ChLinkLock *)this);
  return;
}

Assistant:

ChLinkTrajectory::ChLinkTrajectory() : modulo_s(false) {
    // initializes type
    type = LinkType::TRAJECTORY;

    // default s(t) function. User will provide better fx.
    space_fx = chrono_types::make_shared<ChFunction_Ramp>(0, 1.);

    // default trajectory is a segment
    trajectory_line = chrono_types::make_shared<ChLineSegment>();

    // Mask: initialize our LinkMaskLF (lock formulation mask) to X  only
    mask.SetLockMask(true, true, true, false, false, false, false);

    BuildLink();
}